

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

String * __thiscall
kj::anon_unknown_0::NetworkAddressImpl::toString
          (String *__return_storage_ptr__,NetworkAddressImpl *this)

{
  char *in_RCX;
  anon_class_1_0_00000001 local_39;
  Mapper<kj::Array<kj::(anonymous_namespace)::SocketAddress>_&> local_38;
  NetworkAddressImpl *local_18;
  NetworkAddressImpl *this_local;
  
  local_18 = this;
  this_local = (NetworkAddressImpl *)__return_storage_ptr__;
  kj::_::Mapper<kj::Array<kj::(anonymous_namespace)::SocketAddress>_&>::Mapper
            (&local_38,&this->addrs);
  kj::_::Mapper<kj::Array<kj::(anonymous_namespace)::SocketAddress>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1618:21)>
            ((Array<kj::String> *)&stack0xffffffffffffffd0,&local_38,&local_39);
  strArray<kj::Array<kj::String>>
            (__return_storage_ptr__,(kj *)&stack0xffffffffffffffd0,(Array<kj::String> *)0x9454a9,
             in_RCX);
  Array<kj::String>::~Array((Array<kj::String> *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

String toString() override {
    return strArray(KJ_MAP(addr, addrs) { return addr.toString(); }, ",");
  }